

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Payload>
          (CrateReader *this,vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *d)

{
  pointer pcVar1;
  vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>> *this_00;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined1 *extraout_RAX;
  undefined1 *puVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  uint64_t n;
  uint32_t _n;
  ostringstream ss_e;
  uint32_t shapesize;
  uint64_t local_1f8;
  uint local_1f0;
  uint local_1ec;
  long *local_1e8;
  long local_1d8 [2];
  undefined1 local_1c8 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  bool local_c8;
  storage_t<tinyusdz::Path::PathType> local_c4;
  bool local_c0;
  double local_b8;
  double local_b0;
  vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>> *local_50;
  CrateReader *local_48;
  ulong local_40;
  uint32_t local_34;
  
  if (d == (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)0x0) {
    bVar3 = 0;
    goto LAB_001c7fbd;
  }
  local_1f8 = 0;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar2 = StreamReader::read4(this->_sr,&local_34);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      iVar8 = 0x60d;
LAB_001c7c33:
      poVar4 = (ostream *)::std::ostream::operator<<(local_1c8,iVar8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar9 = "Failed to read the number of array elements.";
      lVar7 = 0x2c;
      goto LAB_001c7f2e;
    }
    bVar2 = StreamReader::read4(this->_sr,&local_1ec);
    if (bVar2) {
      local_1f8 = (uint64_t)local_1ec;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x612);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Failed to read the number of array elements.",0x2c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1e8);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
    }
    if (bVar2) goto LAB_001c7d91;
LAB_001c7faa:
    uVar5 = 0;
  }
  else {
    bVar2 = StreamReader::read8(this->_sr,&local_1f8);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      iVar8 = 0x617;
      goto LAB_001c7c33;
    }
LAB_001c7d91:
    if ((this->_config).maxArrayElements < local_1f8) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x61d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar9 = "Too many array elements.";
      lVar7 = 0x18;
LAB_001c7f2e:
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar9,lVar7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1e8);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
      goto LAB_001c7faa;
    }
    uVar5 = local_1f8 * 0x120 + this->_memoryUsage;
    this->_memoryUsage = uVar5;
    if ((this->_config).maxMemoryBudget < uVar5) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x620);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pcVar9 = "Reached to max memory budget.";
      lVar7 = 0x1d;
      goto LAB_001c7f2e;
    }
    uVar5 = CONCAT71((int7)(uVar5 >> 8),local_1f8 == 0);
    if (local_1f8 != 0) {
      pcVar1 = local_1c8 + 0xf0;
      local_40 = 0;
      local_50 = (vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>> *)d;
      local_48 = this;
      do {
        this_00 = local_50;
        local_1f0 = (uint)uVar5;
        local_1c8._0_8_ = local_1c8 + 0x10;
        local_1c8._8_8_ = 0;
        local_1c8[0x10] = '\0';
        local_1c8._32_8_ = local_1c8 + 0x30;
        local_1c8._40_8_ = 0;
        local_1c8[0x30] = '\0';
        local_1c8._64_8_ = local_1c8 + 0x50;
        local_1c8._72_8_ = 0;
        local_1c8[0x50] = '\0';
        local_1c8._96_8_ = local_1c8 + 0x70;
        local_1c8._104_8_ = 0;
        local_158._M_local_buf[0] = '\0';
        local_148._M_p = local_1c8 + 0x90;
        local_140 = 0;
        local_138._M_local_buf[0] = '\0';
        local_128._M_p = local_1c8 + 0xb0;
        local_120 = 0;
        local_118._M_local_buf[0] = '\0';
        local_108._M_p = local_1c8 + 0xd0;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_c8 = false;
        local_c4 = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_c0 = false;
        local_b8 = 0.0;
        local_b0 = 1.0;
        local_e8._M_p = pcVar1;
        bVar2 = ReadPayload(local_48,(Payload *)local_1c8);
        if (!bVar2) {
          if (local_e8._M_p != pcVar1) {
            operator_delete(local_e8._M_p,
                            CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                            + 1);
          }
          if (local_108._M_p != local_1c8 + 0xd0) {
            operator_delete(local_108._M_p,
                            CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0])
                            + 1);
          }
          if (local_128._M_p != local_1c8 + 0xb0) {
            operator_delete(local_128._M_p,
                            CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]
                                    ) + 1);
          }
          if (local_148._M_p != local_1c8 + 0x90) {
            operator_delete(local_148._M_p,
                            CONCAT71(local_138._M_allocated_capacity._1_7_,local_138._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
            operator_delete((void *)local_1c8._96_8_,
                            CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
            operator_delete((void *)local_1c8._64_8_,CONCAT71(local_1c8._81_7_,local_1c8[0x50]) + 1)
            ;
          }
          if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
            operator_delete((void *)local_1c8._32_8_,CONCAT71(local_1c8._49_7_,local_1c8[0x30]) + 1)
            ;
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
          }
          uVar5 = (ulong)local_1f0;
          break;
        }
        ::std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>::
        emplace_back<tinyusdz::Payload&>(this_00,(Payload *)local_1c8);
        if (local_e8._M_p != pcVar1) {
          operator_delete(local_e8._M_p,
                          CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) +
                          1);
        }
        if (local_108._M_p != local_1c8 + 0xd0) {
          operator_delete(local_108._M_p,
                          CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) +
                          1);
        }
        if (local_128._M_p != local_1c8 + 0xb0) {
          operator_delete(local_128._M_p,
                          CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0])
                          + 1);
        }
        if (local_148._M_p != local_1c8 + 0x90) {
          operator_delete(local_148._M_p,
                          CONCAT71(local_138._M_allocated_capacity._1_7_,local_138._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
          operator_delete((void *)local_1c8._96_8_,
                          CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
          operator_delete((void *)local_1c8._64_8_,CONCAT71(local_1c8._81_7_,local_1c8[0x50]) + 1);
        }
        if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
          operator_delete((void *)local_1c8._32_8_,CONCAT71(local_1c8._49_7_,local_1c8[0x30]) + 1);
        }
        uVar5 = local_40;
        puVar6 = local_1c8 + 0x10;
        if ((undefined1 *)local_1c8._0_8_ != puVar6) {
          operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
          puVar6 = extraout_RAX;
        }
        local_40 = uVar5 + 1;
        uVar5 = CONCAT71((int7)((ulong)puVar6 >> 8),local_40 >= local_1f8);
      } while (local_40 < local_1f8);
    }
  }
  bVar3 = (byte)uVar5;
LAB_001c7fbd:
  return (bool)(bVar3 & 1);
}

Assistant:

bool CrateReader::ReadArray(std::vector<Payload> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (VERSION_LESS_THAN_0_8_0(_version)) {
    uint32_t shapesize; // not used
    if (!_sr->read4(&shapesize)) {
      PUSH_ERROR("Failed to read the number of array elements.");
      return false;
    }
    uint32_t _n;
    if (!_sr->read4(&_n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    n = _n;
  } else {
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Payload) * n);

  for (size_t i = 0; i < n; i++) {
    Payload p;
    if (!ReadPayload(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}